

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O2

void __thiscall
CRenderTools::RenderTeeHand
          (CRenderTools *this,CTeeRenderInfo *pInfo,vec2 CenterPos,vec2 Dir,float AngleOffset,
          vec2 PostRotOffset)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  long lVar5;
  bool bVar6;
  long in_FS_OFFSET;
  float fVar7;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar8;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar9;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar10;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar11;
  float fVar12;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_98;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_94;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_88;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_84;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_68;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_64;
  CQuadItem QuadHand;
  undefined8 local_48;
  float fStack_40;
  float fStack_3c;
  vec2 Dir_local;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  fVar1 = pInfo->m_Size;
  Dir_local = Dir;
  fVar7 = angle(&Dir_local);
  local_88 = CenterPos.field_0;
  aStack_84 = CenterPos.field_1;
  fVar12 = fVar1 * 0.015625 * 15.0;
  fVar1 = pInfo->m_aColors[3].field_0.x;
  fVar2 = pInfo->m_aColors[3].field_1.y;
  fVar3 = pInfo->m_aColors[3].field_2.z;
  fVar4 = pInfo->m_aColors[3].field_3.w;
  QuadHand.m_Width = fVar12 + fVar12;
  local_98 = Dir.field_0;
  aStack_94 = Dir.field_1;
  aVar10 = Dir_local.field_0;
  aVar11 = Dir_local.field_1;
  aVar8.x = -aVar10.x;
  bVar6 = aVar10.x < aVar8.x;
  aVar9 = aVar11;
  if (aVar8.x <= aVar10.x) {
    aVar9.y = aVar11.y ^ 0x80000000;
    aVar8 = aVar10;
  }
  local_68 = PostRotOffset.field_0;
  aStack_64 = PostRotOffset.field_1;
  QuadHand.m_X = aStack_64.y * aVar9.y + local_88.x + local_98.x + local_68.x * aVar10.x;
  QuadHand.m_Y = aStack_64.y * aVar8.x + aStack_84.y + aStack_94.y + local_68.x * aVar11.y;
  local_48 = CONCAT44(QuadHand.m_Y,QuadHand.m_X);
  QuadHand.m_Height = QuadHand.m_Width;
  fStack_40 = QuadHand.m_Width;
  fStack_3c = QuadHand.m_Width;
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])
            (this->m_pGraphics,(ulong)(uint)pInfo->m_aTextures[3].m_Id);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])(fVar1,fVar2,fVar3,fVar4);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x19])
            ((float)(~-(uint)bVar6 & (uint)AngleOffset | (uint)-AngleOffset & -(uint)bVar6) + fVar7)
  ;
  SelectSprite(this,0x4d,0,0,0);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])(this->m_pGraphics,&local_48,1);
  SelectSprite(this,0x4c,0,0,0);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])(this->m_pGraphics,&QuadHand,1);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x19])(0);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar5) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CRenderTools::RenderTeeHand(const CTeeRenderInfo *pInfo, vec2 CenterPos, vec2 Dir, float AngleOffset,
								 vec2 PostRotOffset)
{
	// in-game hand size is 15 when tee size is 64
	float BaseSize = 15.0f * (pInfo->m_Size / 64.0f);

	vec2 HandPos = CenterPos + Dir;
	float Angle = angle(Dir);
	if(Dir.x < 0)
		Angle -= AngleOffset;
	else
		Angle += AngleOffset;

	vec2 DirX = Dir;
	vec2 DirY(-Dir.y,Dir.x);

	if(Dir.x < 0)
		DirY = -DirY;

	HandPos += DirX * PostRotOffset.x;
	HandPos += DirY * PostRotOffset.y;

	const vec4 Color = pInfo->m_aColors[SKINPART_HANDS];
	IGraphics::CQuadItem QuadOutline(HandPos.x, HandPos.y, 2*BaseSize, 2*BaseSize);
	IGraphics::CQuadItem QuadHand = QuadOutline;

	Graphics()->TextureSet(pInfo->m_aTextures[SKINPART_HANDS]);
	Graphics()->QuadsBegin();
	Graphics()->SetColor(Color.r, Color.g, Color.b, Color.a);
	Graphics()->QuadsSetRotation(Angle);

	SelectSprite(SPRITE_TEE_HAND_OUTLINE, 0, 0, 0);
	Graphics()->QuadsDraw(&QuadOutline, 1);
	SelectSprite(SPRITE_TEE_HAND, 0, 0, 0);
	Graphics()->QuadsDraw(&QuadHand, 1);

	Graphics()->QuadsSetRotation(0);
	Graphics()->QuadsEnd();
}